

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall ON_Brep::ChangeVertex(ON_Brep *this,int old_vi,int new_vi,bool bClearTolerances)

{
  ON_BrepVertex *pOVar1;
  int iVar2;
  ON_BrepVertex *pOVar3;
  ON_BrepEdge *pOVar4;
  ON_BrepTrim *pOVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int ei;
  uint local_6c;
  int local_5c;
  ON_BrepVertex *local_58;
  ON_BrepVertex *local_50;
  ON_SimpleArray<int> *local_48;
  long local_40;
  ON_BrepEdge *local_38;
  
  bVar7 = true;
  if (old_vi != new_vi) {
    pOVar3 = Vertex(this,old_vi);
    local_58 = Vertex(this,new_vi);
    if (local_58 == (ON_BrepVertex *)0x0 || pOVar3 == (ON_BrepVertex *)0x0) {
      bVar7 = false;
    }
    else if (pOVar3 != local_58) {
      pOVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_a;
      iVar9 = (int)((ulong)((long)pOVar3 - (long)pOVar1) >> 3) * -0x45d1745d;
      iVar2 = (int)((ulong)((long)local_58 - (long)pOVar1) >> 3);
      iVar6 = iVar2 * -0x45d1745d;
      if (iVar9 + iVar2 * 0x45d1745d != 0) {
        if (0 < (pOVar3->m_ei).m_count) {
          local_48 = &local_58->m_ei;
          lVar8 = 0;
          local_50 = pOVar3;
          do {
            local_5c = (local_50->m_ei).m_a[lVar8];
            local_40 = lVar8;
            pOVar4 = Edge(this,local_5c);
            if (pOVar4 != (ON_BrepEdge *)0x0) {
              local_6c = 0;
              if ((pOVar4->m_vi[0] == local_50->m_vertex_index) ||
                 (local_6c = 1, pOVar4->m_vi[1] == local_50->m_vertex_index)) {
                ON_SimpleArray<int>::Append(local_48,&local_5c);
                pOVar4->m_vi[local_6c] = iVar6;
                if (bClearTolerances) {
                  pOVar4->m_tolerance = -1.23432101234321e+308;
                  local_58->m_tolerance = -1.23432101234321e+308;
                }
                if (0 < (pOVar4->m_ti).m_count) {
                  lVar8 = 0;
                  local_38 = pOVar4;
                  do {
                    pOVar5 = Trim(this,(local_38->m_ti).m_a[lVar8]);
                    if (pOVar5 != (ON_BrepTrim *)0x0) {
                      bVar7 = pOVar5->m_bRev3d;
                      uVar10 = local_6c ^ bVar7;
                      pOVar5->m_vi[uVar10] = iVar6;
                      while( true ) {
                        if (local_6c == bVar7) {
                          iVar2 = PrevTrim(this,pOVar5->m_trim_index);
                        }
                        else {
                          iVar2 = NextTrim(this,pOVar5->m_trim_index);
                        }
                        pOVar5 = Trim(this,iVar2);
                        if ((((pOVar5 == (ON_BrepTrim *)0x0) || (-1 < pOVar5->m_ei)) ||
                            (pOVar5->m_vi[uVar10 ^ 1] != iVar9)) ||
                           (pOVar5->m_vi[uVar10 ^ 1] = iVar6, pOVar5->m_vi[uVar10] != iVar9)) break;
                        pOVar5->m_vi[uVar10] = iVar6;
                      }
                    }
                    lVar8 = lVar8 + 1;
                  } while (lVar8 < (local_38->m_ti).m_count);
                }
              }
            }
            lVar8 = local_40 + 1;
            pOVar3 = local_50;
          } while (lVar8 < (local_50->m_ei).m_count);
        }
        ON_SimpleArray<int>::SetCapacity(&pOVar3->m_ei,0);
        bVar7 = true;
      }
    }
  }
  return bVar7;
}

Assistant:

bool ON_Brep::ChangeVertex( int old_vi, int new_vi, bool bClearTolerances )
{
  if ( old_vi == new_vi )
    return true;

  ON_BrepVertex* old_v = Vertex(old_vi);
  ON_BrepVertex* new_v = Vertex(new_vi);
  
  if ( 0 == old_v )
    return false;
  if ( 0 == new_v )
    return false;
  if( old_v == new_v )
    return true;

  // clear type bits
  old_vi = (int)(old_v - m_V.Array()); // the (int) is for 64 bit size_t conversion
  new_vi = (int)(new_v - m_V.Array());
  if ( old_vi == new_vi )
    return true;

  int vei, evi, eti, tvi, ei;

  for ( vei = 0; vei < old_v->m_ei.Count(); vei++ )
  {
    ei = old_v->m_ei[vei];
    ON_BrepEdge* edge = Edge( ei );
    if ( 0 == edge )
      continue;
    // edges that start/end at the same vertex are listed twice in old_v->m_ei[].
    if ( edge->m_vi[0] == old_v->m_vertex_index )
      evi = 0;
    else if ( edge->m_vi[1] == old_v->m_vertex_index )
      evi = 1;
    else
      continue;

    // connect edge to new vertex
    new_v->m_ei.Append(ei);
    edge->m_vi[evi] = new_vi;
    if ( bClearTolerances )
    {
      edge->m_tolerance = ON_UNSET_VALUE;
      new_v->m_tolerance = ON_UNSET_VALUE;
    }

    for ( eti = 0; eti < edge->m_ti.Count(); eti++ )
    {
      ON_BrepTrim* trim = Trim( edge->m_ti[eti]);
      if ( 0 == trim )
        continue;
      tvi = trim->m_bRev3d ? 1-evi : evi;
      trim->m_vi[tvi] = new_vi;
      for(;;)
      {
        if ( 0 == tvi )
          trim = Trim(PrevTrim(trim->m_trim_index));
        else if ( 1 == tvi )
          trim = Trim(NextTrim(trim->m_trim_index));
        else
          break;

        if ( 0 == trim )
          break;

        if ( trim->m_ei >= 0 )
          break; // not singular

        if ( trim->m_vi[1-tvi] == old_vi )
          trim->m_vi[1-tvi] = new_vi;
        else
          break;

        if ( trim->m_vi[tvi] == old_vi )
          trim->m_vi[tvi] = new_vi;
        else
          break;
      }
    }
  }
  old_v->m_ei.Destroy();
  return true;
}